

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O0

void __thiscall
cnn::RestrictedLogSoftmax::forward_impl
          (RestrictedLogSoftmax *this,
          vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,Tensor *fx)

{
  bool bVar1;
  size_type sVar2;
  Index IVar3;
  Scalar *pSVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDX;
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *in_RSI;
  long in_RDI;
  real rVar5;
  uint i;
  const_iterator __end1;
  const_iterator __begin1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range1;
  real logz;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> x;
  undefined4 in_stack_ffffffffffffff48;
  float in_stack_ffffffffffffff4c;
  Tensor *in_stack_ffffffffffffff60;
  Index in_stack_ffffffffffffff68;
  DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
  *in_stack_ffffffffffffff70;
  Tensor *in_stack_ffffffffffffff78;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffa8;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_stack_ffffffffffffffb0;
  
  sVar2 = std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::size(in_RSI);
  if (sVar2 != 1) {
    __assert_fail("xs.size() == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/nodes.cc"
                  ,0x4fc,
                  "virtual void cnn::RestrictedLogSoftmax::forward_impl(const vector<const Tensor *> &, Tensor &) const"
                 );
  }
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x50));
  if (sVar2 != 0) {
    std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[](in_RSI,0);
    Tensor::operator*(in_stack_ffffffffffffff78);
    IVar3 = Eigen::
            MapBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_0>
            ::cols((MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                    *)0x3d22b3);
    if (IVar3 == 1) {
      rVar5 = logsumexp<Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>>
                        ((Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> *)
                         in_stack_ffffffffffffffb0._M_current,in_stack_ffffffffffffffa8);
      std::numeric_limits<float>::infinity();
      TensorTools::Constant(in_stack_ffffffffffffff60,(float)((ulong)in_RDI >> 0x20));
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                            *)in_RDX,
                           (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                            *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        if (!bVar1) break;
        __gnu_cxx::
        __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator*((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                     *)&stack0xffffffffffffffb0);
        pSVar4 = Eigen::
                 DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
                 ::operator()(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                              (Index)in_stack_ffffffffffffff60);
        in_stack_ffffffffffffff4c = *pSVar4 - rVar5;
        Tensor::operator*(in_stack_ffffffffffffff78);
        pSVar4 = Eigen::
                 DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
                 ::operator()(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                              (Index)in_stack_ffffffffffffff60);
        *pSVar4 = in_stack_ffffffffffffff4c;
        __gnu_cxx::
        __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator++((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      *)&stack0xffffffffffffffb0);
      }
      sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x50));
      if (sVar2 == 1) {
        Tensor::operator*(in_stack_ffffffffffffff78);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::front(in_RDX);
        pSVar4 = Eigen::
                 DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
                 ::operator()(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                              (Index)in_stack_ffffffffffffff60);
        *pSVar4 = 0.0;
      }
      return;
    }
    __assert_fail("x.cols() == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/nodes.cc"
                  ,0x4ff,
                  "virtual void cnn::RestrictedLogSoftmax::forward_impl(const vector<const Tensor *> &, Tensor &) const"
                 );
  }
  __assert_fail("denom.size() > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/nodes.cc"
                ,0x4fd,
                "virtual void cnn::RestrictedLogSoftmax::forward_impl(const vector<const Tensor *> &, Tensor &) const"
               );
}

Assistant:

void RestrictedLogSoftmax::forward_impl(const vector<const Tensor*>& xs, Tensor& fx) const {
#ifdef HAVE_CUDA
  throw std::runtime_error("RestrictedLogSoftmax not yet implemented for CUDA");
#else
  // TODO create auxiliary mask with -infty's
  // and do usual LogSoftmax stuff
  assert(xs.size() == 1);
  assert(denom.size() > 0);
  auto x = **xs[0];
  assert(x.cols() == 1);
  const real logz = logsumexp(x, denom);
  TensorTools::Constant(fx, -numeric_limits<real>::infinity());
  for (auto i : denom)
    (*fx)(i,0) = x(i,0) - logz;
  if (denom.size() == 1) (*fx)(denom.front(), 0) = 0;
#endif
}